

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cp_writer.c
# Opt level: O3

void sendOneToWSRCohort(WS_ReaderInfo CP_WSR_Stream,CMFormat f,void *Msg,void **RS_StreamPtr)

{
  SstStream s;
  CMConnection p_Var1;
  int iVar2;
  int peer;
  uint uVar3;
  long lVar4;
  
  s = CP_WSR_Stream->ParentStream;
  if (s->ConfigParams->CPCommPattern == 1) {
    uVar3 = *CP_WSR_Stream->Peers;
    if (uVar3 != 0xffffffff) {
      lVar4 = 4;
      do {
        p_Var1 = CP_WSR_Stream->Connections[(int)uVar3].CMconn;
        *RS_StreamPtr = CP_WSR_Stream->Connections[(int)uVar3].RemoteStreamID;
        CP_verbose(s,TraceVerbose,"Sending a message to reader %d (%p)\n");
        if (p_Var1 != (CMConnection)0x0) {
          pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
          iVar2 = CMwrite(p_Var1,f,Msg);
          pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
          if (iVar2 != 1) {
            CP_verbose(s,PerStepVerbose,"Message failed to send to reader %d (%p)\n",(ulong)uVar3,
                       *RS_StreamPtr);
            CP_PeerFailCloseWSReader(CP_WSR_Stream,PeerFailed);
          }
        }
        uVar3 = *(uint *)((long)CP_WSR_Stream->Peers + lVar4);
        lVar4 = lVar4 + 4;
      } while (uVar3 != 0xffffffff);
    }
  }
  else if (s->Rank == 0) {
    p_Var1 = CP_WSR_Stream->Connections->CMconn;
    *RS_StreamPtr = CP_WSR_Stream->Connections->RemoteStreamID;
    CP_verbose(s,TraceVerbose,"Sending a message to reader %d (%p)\n",0);
    if (p_Var1 != (CMConnection)0x0) {
      pthread_mutex_unlock((pthread_mutex_t *)&s->DataLock);
      iVar2 = CMwrite(p_Var1,f,Msg);
      pthread_mutex_lock((pthread_mutex_t *)&s->DataLock);
      if (iVar2 != 1) {
        CP_verbose(s,PerStepVerbose,"Message failed to send to reader %d (%p)\n",0,*RS_StreamPtr);
        CP_PeerFailCloseWSReader(CP_WSR_Stream,PeerFailed);
        return;
      }
    }
  }
  return;
}

Assistant:

void sendOneToWSRCohort(WS_ReaderInfo CP_WSR_Stream, CMFormat f, void *Msg, void **RS_StreamPtr)
{
    SstStream Stream = CP_WSR_Stream->ParentStream;
    int j = 0;

    STREAM_ASSERT_LOCKED(Stream);
    if (Stream->ConfigParams->CPCommPattern == SstCPCommPeer)
    {
        while (CP_WSR_Stream->Peers[j] != -1)
        {
            int peer = CP_WSR_Stream->Peers[j];
            CMConnection conn = CP_WSR_Stream->Connections[peer].CMconn;
            /* add the reader-rank-specific Stream identifier to each outgoing
             * message */
            *RS_StreamPtr = CP_WSR_Stream->Connections[peer].RemoteStreamID;
            CP_verbose(Stream, TraceVerbose, "Sending a message to reader %d (%p)\n", peer,
                       (void *)*RS_StreamPtr);

            if (conn)
            {
                int res;
                STREAM_MUTEX_UNLOCK(Stream);
                res = CMwrite(conn, f, Msg);
                STREAM_MUTEX_LOCK(Stream);
                if (res != 1)
                {
                    CP_verbose(Stream, PerStepVerbose, "Message failed to send to reader %d (%p)\n",
                               peer, (void *)*RS_StreamPtr);
                    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerFailed);
                }
            }
            j++;
        }
    }
    else
    {
        /* CommMin */
        if (Stream->Rank == 0)
        {
            int peer = 0;
            CMConnection conn = CP_WSR_Stream->Connections[peer].CMconn;
            /* add the reader-rank-specific Stream identifier to each outgoing
             * message */
            *RS_StreamPtr = CP_WSR_Stream->Connections[peer].RemoteStreamID;
            CP_verbose(Stream, TraceVerbose, "Sending a message to reader %d (%p)\n", peer,
                       (void *)*RS_StreamPtr);

            if (conn)
            {
                int res;
                STREAM_MUTEX_UNLOCK(Stream);
                res = CMwrite(conn, f, Msg);
                STREAM_MUTEX_LOCK(Stream);
                if (res != 1)
                {
                    CP_verbose(Stream, PerStepVerbose, "Message failed to send to reader %d (%p)\n",
                               peer, (void *)*RS_StreamPtr);
                    CP_PeerFailCloseWSReader(CP_WSR_Stream, PeerFailed);
                }
            }
        }
    }
}